

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O1

void Abc_NtkPrintMiniMapping(int *pArray)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  int *__s;
  
  uVar4 = *pArray;
  uVar1 = pArray[1];
  uVar7 = pArray[2];
  printf("Mapped network has %d CIs, %d COs, %d gates, and %d flops.\n",(ulong)uVar4,(ulong)uVar1,
         (ulong)uVar7,(ulong)(uint)pArray[3]);
  printf("The first %d object IDs (from 0 to %d) are reserved for the CIs.\n",(ulong)uVar4,
         (ulong)(uVar4 - 1));
  iVar9 = 4;
  if (0 < (int)uVar7) {
    uVar6 = 0;
    do {
      printf("Node %d has fanins {",(ulong)(uVar6 + uVar4));
      iVar2 = pArray[iVar9];
      iVar9 = iVar9 + 1;
      if (0 < iVar2) {
        lVar5 = 0;
        do {
          printf(" %d",(ulong)(uint)pArray[iVar9 + lVar5]);
          lVar5 = lVar5 + 1;
        } while (iVar2 != (int)lVar5);
        iVar9 = iVar9 + (int)lVar5;
      }
      puts(" }");
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar7);
  }
  if (0 < (int)uVar1) {
    uVar8 = 0;
    do {
      printf("CO %d is driven by node %d\n",uVar8 & 0xffffffff,
             (ulong)(uint)pArray[(long)iVar9 + uVar8]);
      uVar8 = uVar8 + 1;
    } while (uVar1 != (uint)uVar8);
    iVar9 = iVar9 + (uint)uVar8;
  }
  if (0 < (int)uVar7) {
    __s = pArray + iVar9;
    do {
      sVar3 = strlen((char *)__s);
      printf("Node %d has gate \"%s\"\n",uVar4,__s);
      uVar4 = uVar4 + 1;
      uVar7 = uVar7 - 1;
      __s = (int *)((long)__s + sVar3 + 1);
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

void Abc_NtkPrintMiniMapping( int * pArray )
{
    int nCis, nCos, nNodes, nFlops;
    int i, k, nLeaves, Pos = 4;
    char * pBuffer, * pName;
    nCis = pArray[0];
    nCos = pArray[1];
    nNodes = pArray[2];
    nFlops = pArray[3];
    printf( "Mapped network has %d CIs, %d COs, %d gates, and %d flops.\n", nCis, nCos, nNodes, nFlops );
    printf( "The first %d object IDs (from 0 to %d) are reserved for the CIs.\n", nCis, nCis - 1 );
    for ( i = 0; i < nNodes; i++ )
    {
        printf( "Node %d has fanins {", nCis + i );
        nLeaves = pArray[Pos++];
        for ( k = 0; k < nLeaves; k++ )
            printf( " %d", pArray[Pos++] );
        printf( " }\n" );
    }
    for ( i = 0; i < nCos; i++ )
        printf( "CO %d is driven by node %d\n", i, pArray[Pos++] );
    pBuffer = (char *)(pArray + Pos);
    for ( i = 0; i < nNodes; i++ )
    {
        pName = pBuffer;
        pBuffer += strlen(pName) + 1;
        printf( "Node %d has gate \"%s\"\n", nCis + i, pName );
    }
}